

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O3

void ProcessEDLinedef(line_t_conflict *ld,int recordnum)

{
  undefined8 uVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  InitED();
  pNVar2 = EDLines.Nodes + (EDLines.Size - 1 & recordnum);
  while ((pNVar3 = pNVar2, pNVar3 != (Node *)0x0 && (pNVar3->Next != (Node *)0x1))) {
    pNVar2 = pNVar3->Next;
    if ((pNVar3->Pair).Key == recordnum) {
      ld->special = (pNVar3->Pair).Value.special;
      ld->activation = (pNVar3->Pair).Value.activation;
      ld->flags = ld->flags & 0xff7679ff | (pNVar3->Pair).Value.flags;
      ld->alpha = (pNVar3->Pair).Value.alpha;
      uVar1 = *(undefined8 *)((pNVar3->Pair).Value.args + 2);
      *(undefined8 *)ld->args = *(undefined8 *)(pNVar3->Pair).Value.args;
      *(undefined8 *)(ld->args + 2) = uVar1;
      ld->args[4] = (pNVar3->Pair).Value.args[4];
      FTagManager::AddLineID
                (&tagManager,(int)((ulong)((long)ld - (long)lines) >> 3) * 0x286bca1b,
                 (pNVar3->Pair).Value.tag);
      return;
    }
  }
  Printf("EDF Linedef record %d not found\n",recordnum);
  ld->special = 0;
  return;
}

Assistant:

void ProcessEDLinedef(line_t *ld, int recordnum)
{
	InitED();

	EDLinedef *eld = EDLines.CheckKey(recordnum);
	if (eld == NULL)
	{
		Printf("EDF Linedef record %d not found\n", recordnum);
		ld->special = 0;
		return;
	}
	const DWORD fmask = ML_REPEAT_SPECIAL | ML_FIRSTSIDEONLY | ML_ADDTRANS | ML_BLOCKEVERYTHING | ML_ZONEBOUNDARY | ML_CLIP_MIDTEX;
	ld->special = eld->special;
	ld->activation = eld->activation;
	ld->flags = (ld->flags&~fmask) | eld->flags;
	ld->setAlpha(eld->alpha);
	memcpy(ld->args, eld->args, sizeof(ld->args));
	tagManager.AddLineID(int(ld - lines), eld->tag);
}